

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmBinaryReader.cpp
# Opt level: O1

void __thiscall
Wasm::WasmBinaryReader::ReadMemorySection(WasmBinaryReader *this,bool isImportSection)

{
  bool bVar1;
  uint uVar2;
  undefined7 in_register_00000031;
  char16_t *msg;
  WasmBinaryReader *this_00;
  SectionLimits local_20;
  uint32 local_14 [2];
  uint32 length;
  
  local_14[0] = 0;
  uVar2 = 1;
  this_00 = this;
  if ((int)CONCAT71(in_register_00000031,isImportSection) == 0) {
    uVar2 = LEB128<unsigned_int,32u>(this,local_14);
  }
  if (uVar2 < 2) {
    if (uVar2 == 1) {
      this_00 = this;
      local_20 = (SectionLimits)
                 ReadSectionLimitsBase<Wasm::MemorySectionLimits>
                           (this,-(uint)DAT_015aa2e2 | 0x7fff,-(uint)DAT_015aa2e2 | 0x10000,
                            L"memory size too big");
      bVar1 = Threads::IsEnabled();
      if ((bVar1) && ((local_20.flags & 3) == 2)) {
        msg = L"Shared memory must have a maximum size";
        goto LAB_00f24fbd;
      }
      Js::WebAssemblyModule::InitializeMemory(this->m_module,(MemorySectionLimits *)&local_20);
    }
    return;
  }
  msg = L"Maximum of 1 memory allowed";
LAB_00f24fbd:
  ThrowDecodingError(this_00,msg);
}

Assistant:

void WasmBinaryReader::ReadMemorySection(bool isImportSection)
{
    uint32 length = 0;
    uint32 count;
    if (isImportSection)
    {
        count = 1;
    }
    else
    {
        count = LEB128(length);
    }
    if (count > 1)
    {
        ThrowDecodingError(_u("Maximum of 1 memory allowed"));
    }

    if (count == 1)
    {
        MemorySectionLimits limits = ReadSectionLimitsBase<MemorySectionLimits>(Limits::GetMaxMemoryInitialPages(), Limits::GetMaxMemoryMaximumPages(), _u("memory size too big"));
        if (Wasm::Threads::IsEnabled() && limits.IsShared() && !limits.HasMaximum())
        {
            ThrowDecodingError(_u("Shared memory must have a maximum size"));
        }
        m_module->InitializeMemory(&limits);
    }
}